

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerMixin.cpp
# Opt level: O0

TimerId __thiscall
Liby::TimerMixin::runAt(TimerMixin *this,Timestamp *timestamp,BasicHandler *handler)

{
  int iVar1;
  TimerId TVar2;
  undefined1 local_40 [40];
  BasicHandler *handler_local;
  Timestamp *timestamp_local;
  TimerMixin *this_local;
  
  local_40._32_8_ = handler;
  handler_local = (BasicHandler *)timestamp;
  timestamp_local = (Timestamp *)this;
  if (runAt(Liby::Timestamp_const&,std::function<void()>const&)::helper == '\0') {
    iVar1 = __cxa_guard_acquire(&runAt(Liby::Timestamp_const&,std::function<void()>const&)::helper);
    if (iVar1 != 0) {
      anon_unknown.dwarf_28396::TimerMixinHelper::TimerMixinHelper
                ((TimerMixinHelper *)
                 &runAt(Liby::Timestamp_const&,std::function<void()>const&)::helper,&this->loop_);
      __cxa_guard_release(&runAt(Liby::Timestamp_const&,std::function<void()>const&)::helper);
    }
  }
  EventLoop::runAt((EventLoop *)local_40,(Timestamp *)this->loop_,handler_local);
  TVar2 = runHelper(this,(TimerHolder *)local_40);
  TimerHolder::~TimerHolder((TimerHolder *)local_40);
  return TVar2;
}

Assistant:

TimerId TimerMixin::runAt(const Timestamp &timestamp,
                          const BasicHandler &handler) {
    static TimerMixinHelper helper(&loop_);
    return runHelper(loop_->runAt(timestamp, handler));
}